

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,ModuleInstantiationStmt *stmt)

{
  Generator *generator;
  iterator __position;
  bool bVar1;
  uint64_t uVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  generator = stmt->target_;
  bVar1 = Context::has_hash(this->context_,generator);
  if (bVar1) {
    uVar2 = Context::get_hash(this->context_,generator);
    local_48 = (long *)(uVar2 ^ 0xe3779b97f4a7c169);
    __position._M_current =
         (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->stmt_hashes_,__position,(unsigned_long *)&local_48);
    }
    else {
      *__position._M_current = (unsigned_long)local_48;
      (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Internal error: ",&generator->name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_48 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_48 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit(ModuleInstantiationStmt* stmt) override {
        // notice that we don't use any mechanism to lock the context's get hash or set hash
        // it is the caller's responsibility to do prepare the calling sequence so that there
        // won't be any race condition.
        // by requiring this, we can have a lock-free implementation ready to scale
        auto const* target = stmt->target();
        if (!context_->has_hash(target)) {
            throw std::runtime_error("Internal error: " + target->name + " doesn't have a hash");
        }
        uint64_t target_hash = context_->get_hash(target);
        constexpr uint64_t mod_signature = shift_const(0x9e3779b97f4a7c16, 4);
        // we have assign stmts already computed the connections
        stmt_hashes_.emplace_back(target_hash ^ mod_signature);
    }